

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claqgs.c
# Opt level: O2

void claqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  cVar9 = 'N';
  if ((0 < A->nrow) && (0 < A->ncol)) {
    pvVar5 = A->Store;
    lVar6 = *(long *)((long)pvVar5 + 8);
    fVar11 = smach("Safe minimum");
    fVar12 = smach("Precision");
    if ((rowcnd < 0.1) || ((amax < fVar11 / fVar12 || (1.0 / (fVar11 / fVar12) < amax)))) {
      uVar7 = 0;
      if (0 < A->ncol) {
        uVar7 = (ulong)(uint)A->ncol;
      }
      if (0.1 <= colcnd) {
        uVar10 = 0;
        while (uVar10 != uVar7) {
          lVar8 = uVar10 * 4;
          iVar3 = *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + uVar10 * 4);
          uVar10 = uVar10 + 1;
          for (lVar8 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + lVar8); lVar8 < iVar3;
              lVar8 = lVar8 + 1) {
            iVar4 = *(int *)(*(long *)((long)pvVar5 + 0x10) + lVar8 * 4);
            *(float *)(lVar6 + lVar8 * 8) = *(float *)(lVar6 + lVar8 * 8) * r[iVar4];
            *(float *)(lVar6 + 4 + lVar8 * 8) = *(float *)(lVar6 + 4 + lVar8 * 8) * r[iVar4];
          }
        }
        cVar9 = 'R';
      }
      else {
        uVar10 = 0;
        while (uVar10 != uVar7) {
          fVar11 = c[uVar10];
          lVar8 = uVar10 * 4;
          iVar3 = *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + uVar10 * 4);
          uVar10 = uVar10 + 1;
          for (lVar8 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + lVar8); lVar8 < iVar3;
              lVar8 = lVar8 + 1) {
            uVar2 = *(undefined8 *)(lVar6 + lVar8 * 8);
            *(ulong *)(lVar6 + lVar8 * 8) =
                 CONCAT44(r[*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar8 * 4)] * fVar11 *
                          (float)((ulong)uVar2 >> 0x20),
                          r[*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar8 * 4)] * fVar11 *
                          (float)uVar2);
          }
        }
        cVar9 = 'B';
      }
    }
    else if (colcnd < 0.1) {
      uVar10 = 0;
      uVar7 = (ulong)(uint)A->ncol;
      if (A->ncol < 1) {
        uVar7 = uVar10;
      }
      while (uVar10 != uVar7) {
        uVar1 = uVar10 + 1;
        iVar3 = *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + uVar10 * 4);
        fVar11 = c[uVar10];
        for (lVar8 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + uVar10 * 4); uVar10 = uVar1,
            lVar8 < iVar3; lVar8 = lVar8 + 1) {
          uVar2 = *(undefined8 *)(lVar6 + lVar8 * 8);
          *(ulong *)(lVar6 + lVar8 * 8) =
               CONCAT44((float)((ulong)uVar2 >> 0x20) * fVar11,(float)uVar2 * fVar11);
        }
      }
      cVar9 = 'C';
    }
  }
  *equed = cVar9;
  return;
}

Assistant:

void
claqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;
    float temp;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    cs_mult(&Aval[i], &Aval[i], cj);
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		cs_mult(&Aval[i], &Aval[i], r[irow]);
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		temp = cj * r[irow];
		cs_mult(&Aval[i], &Aval[i], temp);
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}